

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::OptUtils::FunctionRefReplacer::create(FunctionRefReplacer *this)

{
  unique_ptr<wasm::OptUtils::FunctionRefReplacer,_std::default_delete<wasm::OptUtils::FunctionRefReplacer>_>
  local_20 [2];
  FunctionRefReplacer *this_local;
  
  this_local = this;
  std::make_unique<wasm::OptUtils::FunctionRefReplacer,std::function<void(wasm::Name&)>&>
            ((function<void_(wasm::Name_&)> *)local_20);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::OptUtils::FunctionRefReplacer,std::default_delete<wasm::OptUtils::FunctionRefReplacer>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::
  unique_ptr<wasm::OptUtils::FunctionRefReplacer,_std::default_delete<wasm::OptUtils::FunctionRefReplacer>_>
  ::~unique_ptr(local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionRefReplacer>(maybeReplace);
  }